

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_ls.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  void *in_stack_00000010;
  char *info_fname;
  SUNLogger logger;
  SUNContext sunctx;
  int monitor;
  sunrealtype nrmfac;
  int nrmfactor;
  int retval;
  int iout;
  int linsolver;
  void *cvode_mem;
  SUNNonlinearSolver NLS;
  SUNLinearSolver LS;
  UserData data;
  N_Vector u;
  sunrealtype tout;
  sunrealtype t;
  sunrealtype reltol;
  sunrealtype abstol;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  void *in_stack_ffffffffffffff68;
  undefined8 local_88;
  sunrealtype in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff88;
  int iVar2;
  N_Vector in_stack_ffffffffffffff90;
  int local_68;
  int local_60;
  uint local_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  UserData local_40;
  N_Vector local_38;
  double local_30;
  undefined1 local_28 [8];
  undefined8 local_20;
  undefined8 local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_38 = (N_Vector)0x0;
  local_40 = (UserData)0x0;
  local_48 = 0;
  local_58 = 0;
  local_68 = 0;
  iVar2 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (1 < in_EDI) {
    local_68 = atoi(*(char **)(in_RSI + 8));
  }
  if (2 < local_8) {
    iVar2 = atoi(*(char **)(local_10 + 0x10));
  }
  SUNContext_Create(0,&stack0xffffffffffffff80);
  iVar1 = check_retval(in_stack_ffffffffffffff68,
                       (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5c);
  if (iVar1 == 0) {
    SUNLogger_Create(0,0,&local_88);
    iVar1 = check_retval(in_stack_ffffffffffffff68,
                         (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c);
    if (iVar1 == 0) {
      if (iVar2 != 0) {
        SUNLogger_SetInfoFilename(local_88,"cvKrylovDemo_ls-info.txt");
        iVar1 = check_retval(in_stack_ffffffffffffff68,
                             (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff5c);
        if (iVar1 != 0) {
          return 1;
        }
      }
      SUNContext_SetLogger(in_stack_ffffffffffffff80,local_88);
      iVar1 = check_retval(in_stack_ffffffffffffff68,
                           (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c);
      if (iVar1 == 0) {
        local_38 = (N_Vector)N_VNew_Serial(200,in_stack_ffffffffffffff80);
        iVar1 = check_retval(in_stack_ffffffffffffff68,
                             (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff5c);
        if (iVar1 == 0) {
          local_40 = AllocUserData();
          iVar1 = check_retval(in_stack_ffffffffffffff68,
                               (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                               ,in_stack_ffffffffffffff5c);
          if (iVar1 == 0) {
            InitUserData(local_40,local_38);
            SetInitialProfiles(in_stack_ffffffffffffff90,
                               (sunrealtype)CONCAT44(iVar2,in_stack_ffffffffffffff88),
                               in_stack_ffffffffffffff80);
            local_18 = 0x3f50624dd2f1a9fc;
            local_20 = 0x3ee4f8b588e368f1;
            local_58 = CVodeCreate(2,in_stack_ffffffffffffff80);
            iVar1 = check_retval(in_stack_ffffffffffffff68,
                                 (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60),
                                 in_stack_ffffffffffffff5c);
            if (iVar1 == 0) {
              CVodeSetUserData(local_58,local_40);
              iVar1 = check_retval(in_stack_ffffffffffffff68,
                                   (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                    in_stack_ffffffffffffff60),
                                   in_stack_ffffffffffffff5c);
              if (iVar1 == 0) {
                CVodeInit(0,local_58,f,local_38);
                iVar1 = check_retval(in_stack_ffffffffffffff68,
                                     (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                      in_stack_ffffffffffffff60),
                                     in_stack_ffffffffffffff5c);
                if (iVar1 == 0) {
                  CVodeSStolerances(local_20,local_18,local_58);
                  iVar1 = check_retval(in_stack_ffffffffffffff68,
                                       (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                        in_stack_ffffffffffffff60),
                                       in_stack_ffffffffffffff5c);
                  if (iVar1 == 0) {
                    if (iVar2 != 0) {
                      CVodeSetMonitorFn(local_58,myMonitorFunction);
                      iVar1 = check_retval(in_stack_ffffffffffffff68,
                                           (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                            in_stack_ffffffffffffff60),
                                           in_stack_ffffffffffffff5c);
                      if (iVar1 != 0) {
                        return 1;
                      }
                      CVodeSetMonitorFrequency(local_58,0x32);
                      iVar1 = check_retval(in_stack_ffffffffffffff68,
                                           (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                            in_stack_ffffffffffffff60),
                                           in_stack_ffffffffffffff5c);
                      if (iVar1 != 0) {
                        return 1;
                      }
                    }
                    local_50 = SUNNonlinSol_Newton(local_38,in_stack_ffffffffffffff80);
                    iVar1 = check_retval(in_stack_ffffffffffffff68,
                                         (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                          in_stack_ffffffffffffff60),
                                         in_stack_ffffffffffffff5c);
                    if (iVar1 == 0) {
                      CVodeSetNonlinearSolver(local_58,local_50);
                      iVar1 = check_retval(in_stack_ffffffffffffff68,
                                           (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                            in_stack_ffffffffffffff60),
                                           in_stack_ffffffffffffff5c);
                      if (iVar1 == 0) {
                        for (local_5c = 0; (int)local_5c < 4; local_5c = local_5c + 1) {
                          if (local_5c != 0) {
                            InitUserData(local_40,local_38);
                            SetInitialProfiles(in_stack_ffffffffffffff90,
                                               (sunrealtype)
                                               CONCAT44(iVar2,in_stack_ffffffffffffff88),
                                               in_stack_ffffffffffffff80);
                            CVodeReInit(0,local_58,local_38);
                            iVar1 = check_retval(in_stack_ffffffffffffff68,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                                  in_stack_ffffffffffffff60),
                                                 in_stack_ffffffffffffff5c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                          }
                          SUNLinSolFree(local_48);
                          local_40->linsolver = local_5c;
                          in_stack_ffffffffffffff68 = (void *)(ulong)local_5c;
                          switch(in_stack_ffffffffffffff68) {
                          case (void *)0x0:
                            printf(" -------");
                            printf(" \n| SPGMR |\n");
                            printf(" -------\n");
                            local_48 = SUNLinSol_SPGMR(local_38,1,0,in_stack_ffffffffffffff80);
                            iVar1 = check_retval(in_stack_ffffffffffffff68,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                                  in_stack_ffffffffffffff60),
                                                 in_stack_ffffffffffffff5c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            CVodeSetLinearSolver(local_58,local_48,0);
                            iVar1 = check_retval(in_stack_ffffffffffffff68,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                                  in_stack_ffffffffffffff60),
                                                 in_stack_ffffffffffffff5c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            break;
                          case (void *)0x1:
                            printf(" ---------");
                            printf(" \n| SPFGMR |\n");
                            printf(" ---------\n");
                            local_48 = SUNLinSol_SPFGMR(local_38,1,0,in_stack_ffffffffffffff80);
                            iVar1 = check_retval(in_stack_ffffffffffffff68,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                                  in_stack_ffffffffffffff60),
                                                 in_stack_ffffffffffffff5c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            CVodeSetLinearSolver(local_58,local_48,0);
                            iVar1 = check_retval(in_stack_ffffffffffffff68,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                                  in_stack_ffffffffffffff60),
                                                 in_stack_ffffffffffffff5c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            break;
                          case (void *)0x2:
                            printf(" -------");
                            printf(" \n| SPBCGS |\n");
                            printf(" -------\n");
                            local_48 = SUNLinSol_SPBCGS(local_38,1,0,in_stack_ffffffffffffff80);
                            iVar1 = check_retval(in_stack_ffffffffffffff68,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                                  in_stack_ffffffffffffff60),
                                                 in_stack_ffffffffffffff5c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            CVodeSetLinearSolver(local_58,local_48,0);
                            iVar1 = check_retval(in_stack_ffffffffffffff68,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                                  in_stack_ffffffffffffff60),
                                                 in_stack_ffffffffffffff5c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            break;
                          case (void *)0x3:
                            printf(" ---------");
                            printf(" \n| SPTFQMR |\n");
                            printf(" ---------\n");
                            local_48 = SUNLinSol_SPTFQMR(local_38,1,0,in_stack_ffffffffffffff80);
                            iVar1 = check_retval(in_stack_ffffffffffffff68,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                                  in_stack_ffffffffffffff60),
                                                 in_stack_ffffffffffffff5c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                            CVodeSetLinearSolver(local_58,local_48,0);
                            iVar1 = check_retval(in_stack_ffffffffffffff68,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                                  in_stack_ffffffffffffff60),
                                                 in_stack_ffffffffffffff5c);
                            if (iVar1 != 0) {
                              return 1;
                            }
                          }
                          CVodeSetPreconditioner(local_58,Precond,PSolve);
                          iVar1 = check_retval(in_stack_ffffffffffffff68,
                                               (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                                in_stack_ffffffffffffff60),
                                               in_stack_ffffffffffffff5c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          in_stack_ffffffffffffff64 = local_68;
                          if (local_68 == 1) {
                            in_stack_ffffffffffffff90 = (N_Vector)sqrt(200.0);
                          }
                          else if (local_68 == 2) {
                            in_stack_ffffffffffffff90 = (N_Vector)0xbff0000000000000;
                          }
                          else {
                            in_stack_ffffffffffffff90 = (N_Vector)0x0;
                          }
                          CVodeSetLSNormFactor(in_stack_ffffffffffffff90,local_58);
                          iVar1 = check_retval(in_stack_ffffffffffffff68,
                                               (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                                in_stack_ffffffffffffff60),
                                               in_stack_ffffffffffffff5c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          printf(" \n2-species diurnal advection-diffusion problem\n\n");
                          local_30 = 7200.0;
                          for (local_60 = 1; local_60 < 0xd; local_60 = local_60 + 1) {
                            CVode(local_30,local_58,local_38,local_28,1);
                            if (iVar2 == 0) {
                              PrintOutput(in_stack_ffffffffffffff90,
                                          (N_Vector)(ulong)in_stack_ffffffffffffff88,
                                          in_stack_ffffffffffffff80);
                            }
                            iVar1 = check_retval(in_stack_ffffffffffffff68,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                                  in_stack_ffffffffffffff60),
                                                 in_stack_ffffffffffffff5c);
                            if (iVar1 != 0) break;
                            local_30 = local_30 + 7200.0;
                          }
                          if (iVar2 != 0) {
                            PrintOutput(in_stack_ffffffffffffff90,
                                        (N_Vector)CONCAT44(iVar2,in_stack_ffffffffffffff88),
                                        in_stack_ffffffffffffff80);
                          }
                          PrintStats(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
                        }
                        N_VDestroy(local_38);
                        FreeUserData((UserData)
                                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
                        CVodeFree(&local_58);
                        SUNLinSolFree(local_48);
                        SUNNonlinSolFree(local_50);
                        SUNLogger_Destroy(&local_88);
                        SUNContext_Free(&stack0xffffffffffffff80);
                        local_4 = 0;
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  sunrealtype abstol, reltol, t, tout;
  N_Vector u;
  UserData data;
  SUNLinearSolver LS;
  SUNNonlinearSolver NLS;
  void* cvode_mem;
  int linsolver, iout, retval;
  int nrmfactor;      /* LS norm conversion factor flag */
  sunrealtype nrmfac; /* LS norm conversion factor      */
  int monitor;        /* LS resiudal monitoring flag    */
  SUNContext sunctx;
  SUNLogger logger;
  const char* info_fname = "cvKrylovDemo_ls-info.txt";

  u         = NULL;
  data      = NULL;
  LS        = NULL;
  cvode_mem = NULL;
  nrmfactor = 0;
  monitor   = 0;

  /* Retrieve the command-line options */
  if (argc > 1) { nrmfactor = atoi(argv[1]); }
  if (argc > 2) { monitor = atoi(argv[2]); }

  /* Create SUNDIALS context and a logger which will record
     nonlinear solver info (e.g., residual) amongst other things. */

  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  retval = SUNLogger_Create(SUN_COMM_NULL, 0, &logger);
  if (check_retval(&retval, "SUNLogger_Create", 1)) { return 1; }

  if (monitor)
  {
    retval = SUNLogger_SetInfoFilename(logger, info_fname);
    if (check_retval(&retval, "SUNLogger_SetInfoFilename", 1)) { return 1; }
  }

  retval = SUNContext_SetLogger(sunctx, logger);
  if (check_retval(&retval, "SUNContext_SetLogger", 1)) { return 1; }

  /* Allocate memory, and set problem data, initial values, tolerances */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }
  data = AllocUserData();
  if (check_retval((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data, u);
  SetInitialProfiles(u, data->dx, data->dy);
  abstol = ATOL;
  reltol = RTOL;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the initial time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Set a function that CVode will call every 50 successful time steps.
   * This will be used to monitor the solution and integrator statistics. */
  if (monitor)
  {
    retval = CVodeSetMonitorFn(cvode_mem, myMonitorFunction);
    if (check_retval(&retval, "CVodeSetMonitorFn", 1)) { return (1); }
    retval = CVodeSetMonitorFrequency(cvode_mem, 50);
    if (check_retval(&retval, "CVodeSetMonitorFrequency", 1)) { return (1); }
  }

  /* Create the SUNNonlinearSolver */
  NLS = SUNNonlinSol_Newton(u, sunctx);
  if (check_retval(&retval, "SUNNonlinSol_Newton", 0)) { return (1); }

  /* Call CVodeSetNonlinearSolver to attach the nonlinear solver to CVode */
  retval = CVodeSetNonlinearSolver(cvode_mem, NLS);
  if (check_retval(&retval, "CVodeSetNonlinearSolver", 1)) { return (1); }

  /* START: Loop through SPGMR, SPFGMR, SPBCG and SPTFQMR linear solver modules */
  for (linsolver = 0; linsolver < 4; ++linsolver)
  {
    if (linsolver != 0)
    {
      /* Re-initialize user data */
      InitUserData(data, u);
      SetInitialProfiles(u, data->dx, data->dy);

      /* Re-initialize CVode for the solution of the same problem, but
       using a different linear solver module */
      retval = CVodeReInit(cvode_mem, T0, u);
      if (check_retval(&retval, "CVodeReInit", 1)) { return (1); }
    }

    /* Free previous linear solver and attach a new linear solver module */
    SUNLinSolFree(LS);

    /* Set the linear solver type in user data */
    data->linsolver = linsolver;

    switch (linsolver)
    {
    /* (a) SPGMR */
    case (USE_SPGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPGMR |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPGMR to specify the linear solver SPGMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPGMR(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;

    /* (b) SPFGMR */
    case (USE_SPFGMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPFGMR |\n");
      printf(" ---------\n");

      /* Call SUNLinSol_SPFGMR to specify the linear solver SPFGMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPFGMR(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPFGMR", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;

    /* (c) SPBCG */
    case (USE_SPBCG):

      /* Print header */
      printf(" -------");
      printf(" \n| SPBCGS |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPBCGS to specify the linear solver SPBCGS with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPBCGS(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPBCGS", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;

    /* (d) SPTFQMR */
    case (USE_SPTFQMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPTFQMR |\n");
      printf(" ---------\n");

      /* Call SUNLinSol_SPTFQMR to specify the linear solver SPTFQMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPTFQMR(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPTFQMR", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;
    }

    /* Set preconditioner setup and solve routines Precond and PSolve,
       and the pointer to the user-defined block data */
    retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
    if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

    /* Set the linear solver tolerance conversion factor */
    switch (nrmfactor)
    {
    case (1):
      /* use the square root of the vector length */
      nrmfac = SQRT((sunrealtype)NEQ);
      break;
    case (2):
      /* compute with dot product */
      nrmfac = -ONE;
      break;
    default:
      /* use the default */
      nrmfac = ZERO;
      break;
    }

    retval = CVodeSetLSNormFactor(cvode_mem, nrmfac);
    if (check_retval(&retval, "CVodeSetLSNormFactor", 1)) { return (1); }

    /* In loop over output points, call CVode, print results, and test for error */
    printf(" \n2-species diurnal advection-diffusion problem\n\n");
    for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
    {
      retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
      if (!monitor) { PrintOutput(cvode_mem, u, t); }
      if (check_retval(&retval, "CVode", 1)) { break; }
    }
    if (monitor) { PrintOutput(cvode_mem, u, t); }
    PrintStats(cvode_mem, linsolver, 1);

  } /* END: Loop through SPGMR, SPBCG and SPTFQMR linear solver modules */

  /* Free memory */
  N_VDestroy(u);
  FreeUserData(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNNonlinSolFree(NLS);
  SUNLogger_Destroy(&logger);
  SUNContext_Free(&sunctx);

  return (0);
}